

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

void testWriteRead(pixels *p,string *tempdir,exr_compression_t comp,char *pattern)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  int ys;
  int ys_00;
  undefined8 uVar5;
  ulong uVar6;
  int xs;
  int xs_00;
  string cppfilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string filename;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  cppfilename._M_dataplus._M_p = (pointer)&cppfilename.field_2;
  pcVar3 = (tempdir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cppfilename,pcVar3,pcVar3 + tempdir->_M_string_length);
  std::__cxx11::string::append((char *)&cppfilename);
  paVar2 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"_imf_test_comp.exr","");
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cppfilename._M_dataplus._M_p != &cppfilename.field_2) {
    uVar5 = cppfilename.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < __str_1._M_string_length + cppfilename._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar2) {
      uVar5 = __str_1.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < __str_1._M_string_length + cppfilename._M_string_length) goto LAB_0010f30c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&__str_1,0,(char *)0x0,(ulong)cppfilename._M_dataplus._M_p);
  }
  else {
LAB_0010f30c:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&cppfilename,(ulong)__str_1._M_dataplus._M_p);
  }
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    filename.field_2._M_allocated_capacity = *psVar1;
    filename.field_2._8_8_ = puVar4[3];
  }
  else {
    filename.field_2._M_allocated_capacity = *psVar1;
    filename._M_dataplus._M_p = (pointer)*puVar4;
  }
  filename._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(char *)psVar1 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cppfilename._M_dataplus._M_p != &cppfilename.field_2) {
    operator_delete(cppfilename._M_dataplus._M_p,cppfilename.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (tempdir->_M_dataplus)._M_p;
  __str_1._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str_1,pcVar3,pcVar3 + tempdir->_M_string_length);
  std::__cxx11::string::append((char *)&__str_1);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_imf_test_comp_cpp.exr","");
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar2) {
    uVar5 = __str_1.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_48 + __str_1._M_string_length) {
    uVar6 = 0xf;
    if (local_50 != local_40) {
      uVar6 = local_40[0];
    }
    if (local_48 + __str_1._M_string_length <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)__str_1._M_dataplus._M_p);
      goto LAB_0010f452;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&__str_1,(ulong)local_50);
LAB_0010f452:
  cppfilename._M_dataplus._M_p = (pointer)&cppfilename.field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    cppfilename.field_2._M_allocated_capacity = *psVar1;
    cppfilename.field_2._8_8_ = puVar4[3];
  }
  else {
    cppfilename.field_2._M_allocated_capacity = *psVar1;
    cppfilename._M_dataplus._M_p = (pointer)*puVar4;
  }
  cppfilename._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(char *)psVar1 = '\0';
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  xs_00 = 1;
  do {
    ys_00 = 1;
    do {
      doWriteRead(p,&filename,&cppfilename,false,xs_00,ys_00,comp,pattern);
      if (ys_00 == 1 && xs_00 == 1) {
        doWriteRead(p,&filename,&cppfilename,true,1,1,comp,pattern);
      }
      ys_00 = ys_00 + 1;
    } while (ys_00 != 3);
    xs_00 = xs_00 + 1;
  } while (xs_00 != 3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cppfilename._M_dataplus._M_p != &cppfilename.field_2) {
    operator_delete(cppfilename._M_dataplus._M_p,cppfilename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void
testWriteRead (
    pixels&            p,
    const std::string& tempdir,
    exr_compression_t  comp,
    const char*        pattern)
{
    std::string filename =
        tempdir + pattern + std::string ("_imf_test_comp.exr");
    std::string cppfilename =
        tempdir + pattern + std::string ("_imf_test_comp_cpp.exr");
    const int maxsampling = 2;
    for (int xs = 1; xs <= maxsampling; ++xs)
    {
        for (int ys = 1; ys <= maxsampling; ++ys)
        {
            doWriteRead (
                p, filename, cppfilename, false, xs, ys, comp, pattern);
            if (xs == 1 && ys == 1)
                doWriteRead (
                    p, filename, cppfilename, true, xs, ys, comp, pattern);
        }
    }
}